

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O0

void __thiscall baryonyx::bit_array_impl::bit_array_impl(bit_array_impl *this,int size)

{
  pointer __first;
  int iVar1;
  int size_local;
  bit_array_impl *this_local;
  
  this->m_size = size;
  iVar1 = this->m_size;
  if (iVar1 < 0) {
    iVar1 = iVar1 + 0x3f;
  }
  this->m_block_size = (iVar1 >> 6) + 1;
  std::make_unique<unsigned_long[]>((size_t)&this->m_data);
  __first = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                      (&this->m_data);
  std::fill_n<unsigned_long*,int,unsigned_long>(__first,this->m_block_size,&k_zeros);
  return;
}

Assistant:

bit_array_impl(int size)
      : m_size(size)
      , m_block_size((m_size / bit_per_block) + 1)
      , m_data(std::make_unique<underlying_type[]>(m_block_size))
    {
        std::fill_n(m_data.get(), m_block_size, k_zeros);
    }